

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  
  if ((name->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                  ,0x536,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (((byte)in_RDX[0xf] & 4) == 0) {
    __assert_fail("name.IsString()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                  ,0x537,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)((ulong)(name->data_).s.str & 0xffffffffffff);
  while( true ) {
    if ((name->data_).f.flags != 3) {
      *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        **)this = rhs;
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/document.h"
                    ,0x4e1,
                    "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (rhs == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((ulong)(name->data_).s.length * 0x20 +
                  ((ulong)(name->data_).s.str & 0xffffffffffff))) break;
    bVar1 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(in_RDX,rhs);
    if (bVar1) break;
    rhs = rhs + 2;
  }
  *(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> **
   )this = rhs;
  return (MemberIterator)(Pointer)this;
}

Assistant:

MemberIterator FindMember(const GenericValue<Encoding, SourceAllocator>& name) {
        RAPIDJSON_ASSERT(IsObject());
        RAPIDJSON_ASSERT(name.IsString());
        MemberIterator member = MemberBegin();
        for ( ; member != MemberEnd(); ++member)
            if (name.StringEqual(member->name))
                break;
        return member;
    }